

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawCircle(Image *dst,int centerX,int centerY,int radius,Color color)

{
  undefined4 local_30;
  undefined4 local_2c;
  int decesionParameter;
  int y;
  int x;
  int radius_local;
  int centerY_local;
  int centerX_local;
  Image *dst_local;
  Color color_local;
  
  decesionParameter = 0;
  local_30 = radius * -2 + 3;
  local_2c = radius;
  while (decesionParameter <= local_2c) {
    ImageDrawPixel(dst,centerX + decesionParameter,centerY + local_2c,color);
    ImageDrawPixel(dst,centerX - decesionParameter,centerY + local_2c,color);
    ImageDrawPixel(dst,centerX + decesionParameter,centerY - local_2c,color);
    ImageDrawPixel(dst,centerX - decesionParameter,centerY - local_2c,color);
    ImageDrawPixel(dst,centerX + local_2c,centerY + decesionParameter,color);
    ImageDrawPixel(dst,centerX - local_2c,centerY + decesionParameter,color);
    ImageDrawPixel(dst,centerX + local_2c,centerY - decesionParameter,color);
    ImageDrawPixel(dst,centerX - local_2c,centerY - decesionParameter,color);
    decesionParameter = decesionParameter + 1;
    if (local_30 < 1) {
      local_30 = local_30 + decesionParameter * 4 + 6;
    }
    else {
      local_2c = local_2c + -1;
      local_30 = local_30 + (decesionParameter - local_2c) * 4 + 10;
    }
  }
  return;
}

Assistant:

void ImageDrawCircle(Image *dst, int centerX, int centerY, int radius, Color color)
{
    int x = 0, y = radius;
    int decesionParameter = 3 - 2*radius;

    while (y >= x)
    {
        ImageDrawPixel(dst, centerX + x, centerY + y, color);
        ImageDrawPixel(dst, centerX - x, centerY + y, color);
        ImageDrawPixel(dst, centerX + x, centerY - y, color);
        ImageDrawPixel(dst, centerX - x, centerY - y, color);
        ImageDrawPixel(dst, centerX + y, centerY + x, color);
        ImageDrawPixel(dst, centerX - y, centerY + x, color);
        ImageDrawPixel(dst, centerX + y, centerY - x, color);
        ImageDrawPixel(dst, centerX - y, centerY - x, color);
        x++;

        if (decesionParameter > 0)
        {
            y--;
            decesionParameter = decesionParameter + 4*(x - y) + 10;
        }
        else decesionParameter = decesionParameter + 4*x + 6;
    }
}